

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void putword(int offset,int data)

{
  int iVar1;
  long lVar2;
  uchar uVar3;
  
  iVar1 = bank;
  lVar2 = (long)bank;
  if (offset < 0x1fff && lVar2 < 0xf0) {
    rom[lVar2][offset] = (uchar)data;
    uVar3 = (char)(page << 5) + (char)section;
    map[lVar2][offset] = uVar3;
    rom[lVar2][(long)offset + 1] = (uchar)((uint)data >> 8);
    map[lVar2][(long)offset + 1] = uVar3;
    if (max_bank < iVar1) {
      max_bank = iVar1;
    }
  }
  return;
}

Assistant:

void
putword(int offset, int data)
{
	if (bank >= RESERVED_BANK)
		return;
	if (offset < 0x1FFF) {
		/* low byte */
		rom[bank][offset] = (data) & 0xFF;
		map[bank][offset] = section + (page << 5);

		/* high byte */
		rom[bank][offset+1] = (data >> 8) & 0xFF;
		map[bank][offset+1] = section + (page << 5);

		/* update rom size */
		if (bank > max_bank)
			max_bank = bank;
	}
}